

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimfmtprops.cpp
# Opt level: O2

bool __thiscall
icu_63::number::impl::DecimalFormatProperties::_equals
          (DecimalFormatProperties *this,DecimalFormatProperties *other,bool ignoreForFastFormat)

{
  bool bVar1;
  bool bVar2;
  UBool UVar3;
  
  bVar2 = (this->compactStyle).fNull;
  bVar1 = (other->compactStyle).fNull;
  if (((bVar2 | bVar1) & 1U) == 0) {
    if ((this->compactStyle).fValue == (other->compactStyle).fValue) goto LAB_0025720e;
  }
  else if ((bVar2 & bVar1) == 1) {
LAB_0025720e:
    bVar2 = NullableValue<icu_63::CurrencyUnit>::operator==(&this->currency,&other->currency);
    if ((bVar2) &&
       ((this->currencyPluralInfo).fPtr.super_LocalPointerBase<icu_63::CurrencyPluralInfo>.ptr ==
        (other->currencyPluralInfo).fPtr.super_LocalPointerBase<icu_63::CurrencyPluralInfo>.ptr)) {
      bVar2 = (this->currencyUsage).fNull;
      bVar1 = (other->currencyUsage).fNull;
      if (((bVar2 | bVar1) & 1U) == 0) {
        if ((this->currencyUsage).fValue == (other->currencyUsage).fValue) goto LAB_00257376;
      }
      else if ((bVar2 & bVar1) == 1) {
LAB_00257376:
        if (((((this->decimalSeparatorAlwaysShown == other->decimalSeparatorAlwaysShown) &&
              (this->exponentSignAlwaysShown == other->exponentSignAlwaysShown)) &&
             (this->formatFailIfMoreThanMaxDigits == other->formatFailIfMoreThanMaxDigits)) &&
            (((this->formatWidth == other->formatWidth &&
              (this->magnitudeMultiplier == other->magnitudeMultiplier)) &&
             ((this->maximumSignificantDigits == other->maximumSignificantDigits &&
              ((this->minimumExponentDigits == other->minimumExponentDigits &&
               (this->minimumGroupingDigits == other->minimumGroupingDigits)))))))) &&
           ((this->minimumSignificantDigits == other->minimumSignificantDigits &&
            ((((this->multiplier == other->multiplier &&
               (this->multiplierScale == other->multiplierScale)) &&
              (UVar3 = UnicodeString::operator==(&this->negativePrefix,&other->negativePrefix),
              UVar3 != '\0')) &&
             (UVar3 = UnicodeString::operator==(&this->negativeSuffix,&other->negativeSuffix),
             UVar3 != '\0')))))) {
          bVar2 = (this->padPosition).fNull;
          bVar1 = (other->padPosition).fNull;
          if (((bVar2 | bVar1) & 1U) == 0) {
            if ((this->padPosition).fValue == (other->padPosition).fValue) goto LAB_002574b2;
          }
          else if ((bVar2 & bVar1) == 1) {
LAB_002574b2:
            UVar3 = UnicodeString::operator==(&this->padString,&other->padString);
            if (((UVar3 != '\0') &&
                (UVar3 = UnicodeString::operator==(&this->positivePrefix,&other->positivePrefix),
                UVar3 != '\0')) &&
               ((UVar3 = UnicodeString::operator==(&this->positiveSuffix,&other->positiveSuffix),
                UVar3 != '\0' &&
                ((this->roundingIncrement == other->roundingIncrement &&
                 (!NAN(this->roundingIncrement) && !NAN(other->roundingIncrement))))))) {
              bVar2 = (this->roundingMode).fNull;
              bVar1 = (other->roundingMode).fNull;
              if (((bVar2 | bVar1) & 1U) == 0) {
                if ((this->roundingMode).fValue == (other->roundingMode).fValue) goto LAB_0025754f;
              }
              else if ((bVar2 & bVar1) == 1) {
LAB_0025754f:
                if (this->secondaryGroupingSize == other->secondaryGroupingSize) {
                  bVar2 = this->signAlwaysShown == other->signAlwaysShown;
                  goto LAB_0025722f;
                }
              }
            }
          }
        }
      }
    }
  }
  bVar2 = false;
LAB_0025722f:
  if (ignoreForFastFormat) {
    return bVar2;
  }
  if (((((bVar2 & this->groupingSize == other->groupingSize) == 1) &&
       (this->groupingUsed == other->groupingUsed)) &&
      (this->minimumFractionDigits == other->minimumFractionDigits)) &&
     (((((this->maximumFractionDigits == other->maximumFractionDigits &&
         (this->maximumIntegerDigits == other->maximumIntegerDigits)) &&
        ((this->minimumIntegerDigits == other->minimumIntegerDigits &&
         ((UVar3 = UnicodeString::operator==
                             (&this->negativePrefixPattern,&other->negativePrefixPattern),
          UVar3 != '\0' &&
          (UVar3 = UnicodeString::operator==
                             (&this->negativeSuffixPattern,&other->negativeSuffixPattern),
          UVar3 != '\0')))))) &&
       (UVar3 = UnicodeString::operator==
                          (&this->positivePrefixPattern,&other->positivePrefixPattern),
       UVar3 != '\0')) &&
      ((((UVar3 = UnicodeString::operator==
                            (&this->positiveSuffixPattern,&other->positiveSuffixPattern),
         UVar3 != '\0' && (this->decimalPatternMatchRequired == other->decimalPatternMatchRequired))
        && (this->parseCaseSensitive == other->parseCaseSensitive)) &&
       (this->parseIntegerOnly == other->parseIntegerOnly)))))) {
    bVar2 = (this->parseMode).fNull;
    bVar1 = (other->parseMode).fNull;
    if (((bVar2 | bVar1) & 1U) == 0) {
      if ((this->parseMode).fValue != (other->parseMode).fValue) {
        return false;
      }
    }
    else if ((bVar2 & bVar1) != 1) {
      return false;
    }
    if ((this->parseNoExponent == other->parseNoExponent) &&
       (this->parseToBigDecimal == other->parseToBigDecimal)) {
      return this->parseAllInput == other->parseAllInput;
    }
  }
  return false;
}

Assistant:

bool
DecimalFormatProperties::_equals(const DecimalFormatProperties& other, bool ignoreForFastFormat) const {
    bool eq = true;

    // Properties that must be equal both normally and for fast-path formatting
    eq = eq && compactStyle == other.compactStyle;
    eq = eq && currency == other.currency;
    eq = eq && currencyPluralInfo.fPtr.getAlias() == other.currencyPluralInfo.fPtr.getAlias();
    eq = eq && currencyUsage == other.currencyUsage;
    eq = eq && decimalSeparatorAlwaysShown == other.decimalSeparatorAlwaysShown;
    eq = eq && exponentSignAlwaysShown == other.exponentSignAlwaysShown;
    eq = eq && formatFailIfMoreThanMaxDigits == other.formatFailIfMoreThanMaxDigits;
    eq = eq && formatWidth == other.formatWidth;
    eq = eq && magnitudeMultiplier == other.magnitudeMultiplier;
    eq = eq && maximumSignificantDigits == other.maximumSignificantDigits;
    eq = eq && minimumExponentDigits == other.minimumExponentDigits;
    eq = eq && minimumGroupingDigits == other.minimumGroupingDigits;
    eq = eq && minimumSignificantDigits == other.minimumSignificantDigits;
    eq = eq && multiplier == other.multiplier;
    eq = eq && multiplierScale == other.multiplierScale;
    eq = eq && negativePrefix == other.negativePrefix;
    eq = eq && negativeSuffix == other.negativeSuffix;
    eq = eq && padPosition == other.padPosition;
    eq = eq && padString == other.padString;
    eq = eq && positivePrefix == other.positivePrefix;
    eq = eq && positiveSuffix == other.positiveSuffix;
    eq = eq && roundingIncrement == other.roundingIncrement;
    eq = eq && roundingMode == other.roundingMode;
    eq = eq && secondaryGroupingSize == other.secondaryGroupingSize;
    eq = eq && signAlwaysShown == other.signAlwaysShown;

    if (ignoreForFastFormat) {
        return eq;
    }

    // Properties ignored by fast-path formatting
    // Formatting (special handling required):
    eq = eq && groupingSize == other.groupingSize;
    eq = eq && groupingUsed == other.groupingUsed;
    eq = eq && minimumFractionDigits == other.minimumFractionDigits;
    eq = eq && maximumFractionDigits == other.maximumFractionDigits;
    eq = eq && maximumIntegerDigits == other.maximumIntegerDigits;
    eq = eq && minimumIntegerDigits == other.minimumIntegerDigits;
    eq = eq && negativePrefixPattern == other.negativePrefixPattern;
    eq = eq && negativeSuffixPattern == other.negativeSuffixPattern;
    eq = eq && positivePrefixPattern == other.positivePrefixPattern;
    eq = eq && positiveSuffixPattern == other.positiveSuffixPattern;

    // Parsing (always safe to ignore):
    eq = eq && decimalPatternMatchRequired == other.decimalPatternMatchRequired;
    eq = eq && parseCaseSensitive == other.parseCaseSensitive;
    eq = eq && parseIntegerOnly == other.parseIntegerOnly;
    eq = eq && parseMode == other.parseMode;
    eq = eq && parseNoExponent == other.parseNoExponent;
    eq = eq && parseToBigDecimal == other.parseToBigDecimal;
    eq = eq && parseAllInput == other.parseAllInput;

    return eq;
}